

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<16U,_8U,_buffer_layout_bfs>::operator()
          (fill<16U,_8U,_buffer_layout_bfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  uchar **ppuVar6;
  uchar **ppuVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar **local_80;
  long local_70;
  uchar **local_68;
  size_t local_58;
  DI local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"fill_leaf");
  poVar3 = std::operator<<(poVar3,", leaf,  I=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  if (buffer_count->_M_elems[8] != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 16U, I = 8U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  local_58 = streams->_M_elems[0].n;
  uVar9 = streams->_M_elems[1].n;
  uVar1 = uVar9 + local_58;
  if (uVar1 < 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"need=");
    local_80 = (uchar **)0x8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    if (local_58 != 0) {
      if (uVar9 == 0) {
        local_70 = 8;
LAB_00131879:
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,"right drained, Ln=");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", Rn=");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"\n");
        memcpy(buffer + -uVar1 + 0x118 + (8 - local_70),streams->_M_elems[0].stream,local_58 << 3);
        streams->_M_elems[0].n = 0;
        buffer_count->_M_elems[8] = uVar1;
        check_input(buffer + -uVar1 + 0x118,uVar1);
        goto LAB_001319f0;
      }
      local_80 = streams->_M_elems[0].stream;
      lVar5 = 8;
      ppuVar6 = streams->_M_elems[1].stream;
      do {
        uVar4 = uVar9;
        local_70 = lVar5;
        lVar5 = -1;
        uVar10 = 0;
        ppuVar7 = ppuVar6;
        while (iVar2 = cmp(*local_80,ppuVar6[uVar10]), 0 < iVar2) {
          buffer[((uVar10 + 0x120) - local_70) - uVar1] = ppuVar6[uVar10];
          ppuVar7 = ppuVar7 + 1;
          streams->_M_elems[1].stream = ppuVar7;
          streams->_M_elems[1].n = lVar5 + uVar4;
          uVar10 = uVar10 + 1;
          lVar5 = lVar5 + -1;
          if (uVar4 == uVar10) {
            local_70 = local_70 - uVar10;
            goto LAB_00131879;
          }
        }
        buffer[((uVar10 + 0x120) - local_70) - uVar1] = *local_80;
        local_80 = local_80 + 1;
        streams->_M_elems[0].stream = local_80;
        local_58 = local_58 - 1;
        streams->_M_elems[0].n = local_58;
        lVar5 = ~uVar10 + local_70;
        uVar9 = uVar4 - uVar10;
        ppuVar6 = ppuVar7;
      } while (local_58 != 0);
      uVar9 = uVar4 - uVar10;
      local_80 = (uchar **)(~uVar10 + local_70);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"left drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    if (uVar9 != 0) {
      memcpy(buffer + -uVar1 + (0x120 - (long)local_80),streams->_M_elems[1].stream,uVar9 << 3);
    }
    streams->_M_elems[1].n = 0;
    buffer_count->_M_elems[8] = uVar1;
    goto LAB_001319f0;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"need=");
  lVar5 = 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", Ln=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", Rn=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  if (local_58 == 0) {
LAB_001317b8:
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"left drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    ppuVar6 = streams->_M_elems[1].stream;
    if (lVar5 != 0) {
      memcpy(buffer + (0x118 - lVar5),ppuVar6,lVar5 * 8);
    }
    streams->_M_elems[1].n = uVar9 - lVar5;
    streams->_M_elems[1].stream = ppuVar6 + lVar5;
  }
  else {
    if (uVar9 != 0) {
      local_68 = streams->_M_elems[0].stream;
      uVar1 = 8;
      ppuVar6 = streams->_M_elems[1].stream;
      do {
        uVar10 = uVar9;
        uVar4 = uVar1;
        uVar8 = 0;
        ppuVar7 = ppuVar6;
        lVar5 = -1;
        while( true ) {
          if (uVar4 == uVar8) goto LAB_001319e0;
          iVar2 = cmp(*local_68,ppuVar6[uVar8]);
          if (iVar2 < 1) break;
          buffer[(uVar8 + 0x118) - uVar4] = ppuVar6[uVar8];
          ppuVar7 = ppuVar7 + 1;
          streams->_M_elems[1].stream = ppuVar7;
          streams->_M_elems[1].n = lVar5 + uVar10;
          uVar8 = uVar8 + 1;
          lVar5 = lVar5 + -1;
          if (uVar10 == uVar8) {
            lVar5 = uVar4 - uVar8;
            goto LAB_0013194e;
          }
        }
        buffer[(uVar8 + 0x118) - uVar4] = *local_68;
        local_68 = local_68 + 1;
        streams->_M_elems[0].stream = local_68;
        local_58 = local_58 - 1;
        streams->_M_elems[0].n = local_58;
        uVar1 = ~uVar8 + uVar4;
        uVar9 = uVar10 - uVar8;
        ppuVar6 = ppuVar7;
      } while (local_58 != 0);
      uVar9 = uVar10 - uVar8;
      lVar5 = ~uVar8 + uVar4;
      goto LAB_001317b8;
    }
    lVar5 = 8;
LAB_0013194e:
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"right drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    ppuVar6 = streams->_M_elems[0].stream;
    if (lVar5 != 0) {
      memcpy(buffer + (0x118 - lVar5),ppuVar6,lVar5 * 8);
    }
    streams->_M_elems[0].n = local_58 - lVar5;
    streams->_M_elems[0].stream = ppuVar6 + lVar5;
  }
LAB_001319e0:
  buffer_count->_M_elems[8] = 8;
  check_input(buffer + 0x110,8);
LAB_001319f0:
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}